

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O3

void Ivy_ManStopFanout(Ivy_Man_t *p)

{
  void **ppvVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  if (p->fFanout != 0) {
    p->fFanout = 0;
    lVar3 = (long)p->vObjs->nSize;
    if (0 < lVar3) {
      ppvVar1 = p->vObjs->pArray;
      lVar4 = 0;
      do {
        pvVar2 = ppvVar1[lVar4];
        if (pvVar2 != (void *)0x0) {
          *(undefined8 *)((long)pvVar2 + 0x30) = 0;
          *(undefined8 *)((long)pvVar2 + 0x38) = 0;
          *(undefined8 *)((long)pvVar2 + 0x20) = 0;
          *(undefined8 *)((long)pvVar2 + 0x28) = 0;
          *(undefined8 *)((long)pvVar2 + 0x40) = 0;
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    return;
  }
  __assert_fail("p->fFanout",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                ,0xa6,"void Ivy_ManStopFanout(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManStopFanout( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->fFanout );
    p->fFanout = 0;
    Ivy_ManForEachObj( p, pObj, i )
        pObj->pFanout = pObj->pNextFan0 = pObj->pNextFan1 = pObj->pPrevFan0 = pObj->pPrevFan1 = NULL;
}